

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgEnc.c
# Opt level: O3

void zvgEnc(int xStart,int yStart,int xEnd,int yEnd)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  byte bVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  uint uVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  uchar uVar19;
  uint yStart_00;
  uchar uVar20;
  uint xStart_00;
  byte bVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  
  ZvgENC.vecCount = ZvgENC.vecCount + 1;
  xStart_00 = -(ZvgENC.encFlags & 1) ^ xStart;
  uVar23 = -(ZvgENC.encFlags & 1) ^ xEnd;
  uVar24 = (int)(ZvgENC.encFlags << 0x1e) >> 0x1f;
  yStart_00 = uVar24 ^ yStart;
  uVar24 = uVar24 ^ yEnd;
  if (yStart != yEnd && xStart != xEnd) {
    lVar27 = (long)(int)xStart_00;
    lVar16 = (int)uVar23 - lVar27;
    uVar28 = ((lVar27 - ZvgENC.xMinClip) * 0x10000) / -lVar16;
    if (lVar16 < 1) {
      if ((long)uVar28 < 0) {
        return;
      }
      uVar26 = 0x10000;
      if (uVar28 < 0x10000) {
        uVar26 = uVar28;
      }
      lVar27 = ZvgENC.xMaxClip - lVar27;
      if (-1 < lVar16) {
        uVar22 = 0;
        goto LAB_00102c4e;
      }
      uVar28 = (lVar27 * 0x10000) / lVar16;
      if ((long)uVar26 < (long)uVar28) {
        return;
      }
      uVar22 = 0;
      if (0 < (long)uVar28) {
        uVar22 = uVar28;
      }
    }
    else {
      if (0x10000 < (long)uVar28) {
        return;
      }
      uVar22 = 0;
      if (0 < (long)uVar28) {
        uVar22 = uVar28;
      }
      lVar27 = ZvgENC.xMaxClip - lVar27;
      uVar26 = 0x10000;
LAB_00102c4e:
      uVar28 = (lVar27 << 0x10) / lVar16;
      if ((long)uVar28 < (long)uVar22) {
        return;
      }
      if (uVar28 < uVar26) {
        uVar26 = uVar28;
      }
    }
    lVar27 = (long)(int)yStart_00;
    lVar29 = (int)uVar24 - lVar27;
    uVar28 = ((lVar27 - ZvgENC.yMinClip) * 0x10000) / -lVar29;
    if (lVar29 < 1) {
      if ((long)uVar28 < (long)uVar22) {
        return;
      }
      if (uVar28 < uVar26) {
        uVar26 = uVar28;
      }
      lVar27 = ZvgENC.yMaxClip - lVar27;
      if (-1 < lVar29) goto LAB_00102e88;
      uVar28 = (lVar27 * 0x10000) / lVar29;
      if ((long)uVar26 < (long)uVar28) {
        return;
      }
      if ((long)uVar22 < (long)uVar28) {
        uVar22 = uVar28;
      }
LAB_00103460:
      uVar28 = uVar26;
      if (uVar28 < 0x10000) goto LAB_0010346c;
    }
    else {
      if ((long)uVar26 < (long)uVar28) {
        return;
      }
      if ((long)uVar22 < (long)uVar28) {
        uVar22 = uVar28;
      }
      lVar27 = ZvgENC.yMaxClip - lVar27;
LAB_00102e88:
      uVar28 = (lVar27 << 0x10) / lVar29;
      if ((long)uVar28 < (long)uVar22) {
        return;
      }
      if (uVar26 <= uVar28) goto LAB_00103460;
LAB_0010346c:
      uVar23 = (int)(uVar28 * lVar16 + 0x8000 >> 0x10) + xStart_00;
      uVar24 = (int)(uVar28 * lVar29 + 0x8000 >> 0x10) + yStart_00;
    }
    if (uVar22 != 0) {
      xStart_00 = xStart_00 + (int)(lVar16 * uVar22 + 0x8000 >> 0x10);
      yStart_00 = yStart_00 + (int)(lVar29 * uVar22 + 0x8000 >> 0x10);
    }
  }
  if ((uVar23 == xStart_00) && (uVar24 == yStart_00)) {
    if ((int)xStart_00 < ZvgENC.xMinClip) {
      return;
    }
    if (ZvgENC.xMaxClip < (int)xStart_00) {
      return;
    }
    if ((int)yStart_00 < ZvgENC.yMinClip) {
      return;
    }
    if (ZvgENC.yMaxClip < (int)yStart_00) {
      return;
    }
LAB_00102ae8:
    zvgEncPointSK(xStart_00,yStart_00,ZvgENC.encColor);
    return;
  }
  uVar12 = uVar24 - yStart_00;
  bVar21 = (ZvgENC.encColor != ZvgENC.zColor) * '@';
  bVar8 = ZvgENC.yPos == yStart_00;
  bVar9 = ZvgENC.xPos == xStart_00;
  bVar5 = bVar21 | 0x90;
  if (bVar8 && bVar9) {
    bVar5 = bVar21 + 0x10;
  }
  uVar25 = uVar23 - xStart_00;
  bVar1 = (int)uVar23 < (int)xStart_00;
  uVar6 = -uVar25;
  if (0 < (int)uVar25) {
    uVar6 = uVar25;
  }
  uVar28 = CONCAT44(0,uVar6);
  uVar7 = -uVar12;
  if (0 < (int)uVar12) {
    uVar7 = uVar12;
  }
  iVar15 = uVar24 - yStart_00;
  bVar2 = (int)uVar24 < (int)yStart_00;
  uVar19 = (uchar)yStart_00;
  bVar21 = (byte)(yStart_00 >> 8);
  if (iVar15 == 0) {
    if ((int)yStart_00 < ZvgENC.yMinClip) {
      return;
    }
    if (ZvgENC.yMaxClip < (int)yStart_00) {
      return;
    }
    if ((int)uVar23 < (int)xStart_00) {
      if (ZvgENC.xMaxClip < (int)uVar23) {
        return;
      }
      if ((int)xStart_00 < ZvgENC.xMinClip) {
        return;
      }
      iVar15 = ZvgENC.xMinClip - uVar23;
      uVar24 = ZvgENC.xMinClip;
      if (iVar15 < 1) {
        iVar15 = 0;
        uVar24 = uVar23;
      }
      uVar12 = xStart_00 - (iVar15 + uVar23);
      uVar28 = (ulong)uVar12;
      uVar23 = uVar24;
      if (!bVar8 || !bVar9) {
        iVar15 = 0;
        if (0 < (int)(xStart_00 - ZvgENC.xMaxClip)) {
          iVar15 = xStart_00 - ZvgENC.xMaxClip;
          xStart_00 = ZvgENC.xMaxClip;
        }
        uVar28 = (ulong)(uVar12 - iVar15);
      }
    }
    else {
      if ((int)uVar23 < ZvgENC.xMinClip) {
        return;
      }
      if (ZvgENC.xMaxClip < (int)xStart_00) {
        return;
      }
      iVar15 = uVar23 - ZvgENC.xMaxClip;
      uVar24 = ZvgENC.xMaxClip;
      if (iVar15 < 1) {
        iVar15 = 0;
        uVar24 = uVar23;
      }
      uVar23 = uVar24;
      uVar25 = uVar25 - iVar15;
      if (!bVar8 || !bVar9) {
        iVar15 = 0;
        if (0 < (int)(ZvgENC.xMinClip - xStart_00)) {
          iVar15 = ZvgENC.xMinClip - xStart_00;
          xStart_00 = ZvgENC.xMinClip;
        }
        uVar25 = uVar25 - iVar15;
      }
      uVar28 = (ulong)uVar25;
    }
    if ((uint)uVar28 == 0) goto LAB_00102ae8;
    if ((ZvgENC.encFlags & 4) != 0) {
      if ((int)xStart_00 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = xStart_00;
      }
      if (ZvgENC.xMaxSpot < (int)xStart_00) {
        ZvgENC.xMaxSpot = xStart_00;
      }
      if ((int)uVar23 < ZvgENC.xMinSpot) {
        ZvgENC.xMinSpot = uVar23;
      }
      if (ZvgENC.xMaxSpot < (int)uVar23) {
        ZvgENC.xMaxSpot = uVar23;
      }
      if ((int)yStart_00 < ZvgENC.yMinSpot) {
        ZvgENC.yMinSpot = yStart_00;
      }
      if (ZvgENC.yMaxSpot < (int)yStart_00) {
        ZvgENC.yMaxSpot = yStart_00;
      }
    }
    bVar17 = bVar5 | 0x20;
    if (0xff < (uint)uVar28) {
      bVar17 = bVar5;
    }
    uVar26 = (ulong)ZvgENC.encCount;
    ZvgENC.encCount = ZvgENC.encCount + 1;
    ZvgENC.encBfr[uVar26] = bVar1 | bVar17 | 4;
    if ((bVar17 & 0x40) != 0) {
      uVar26 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar26] = ZvgENC.encColor._1_1_;
      uVar26 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar26] = (uchar)ZvgENC.encColor;
    }
    if (0x7f < bVar17) {
      uVar26 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar26] = (uchar)xStart_00;
      uVar26 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar26] = bVar21 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
      uVar26 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar26] = uVar19;
    }
    uVar24 = yStart_00;
    if ((bVar17 & 0x20) != 0) goto LAB_001032b3;
    bVar17 = (byte)(uVar28 >> 8) & 0xf;
  }
  else {
    uVar20 = (uchar)xStart_00;
    if (uVar23 == xStart_00) {
      if ((int)xStart_00 < ZvgENC.xMinClip) {
        return;
      }
      if (ZvgENC.xMaxClip < (int)xStart_00) {
        return;
      }
      if ((int)uVar24 < (int)yStart_00) {
        if (ZvgENC.yMaxClip < (int)uVar24) {
          return;
        }
        if ((int)yStart_00 < ZvgENC.yMinClip) {
          return;
        }
        iVar15 = ZvgENC.yMinClip - uVar24;
        uVar23 = ZvgENC.yMinClip;
        if (iVar15 < 1) {
          iVar15 = 0;
          uVar23 = uVar24;
        }
        uVar12 = yStart_00 - (iVar15 + uVar24);
        uVar28 = (ulong)uVar12;
        uVar24 = uVar23;
        if (!bVar8 || !bVar9) {
          iVar15 = 0;
          if (0 < (int)(yStart_00 - ZvgENC.yMaxClip)) {
            iVar15 = yStart_00 - ZvgENC.yMaxClip;
            yStart_00 = ZvgENC.yMaxClip;
          }
          uVar28 = (ulong)(uVar12 - iVar15);
        }
      }
      else {
        if ((int)uVar24 < ZvgENC.yMinClip) {
          return;
        }
        if (ZvgENC.yMaxClip < (int)yStart_00) {
          return;
        }
        iVar13 = uVar24 - ZvgENC.yMaxClip;
        uVar23 = ZvgENC.yMaxClip;
        if (iVar13 < 1) {
          iVar13 = 0;
          uVar23 = uVar24;
        }
        uVar24 = uVar23;
        uVar23 = iVar15 - iVar13;
        if (!bVar8 || !bVar9) {
          iVar15 = ZvgENC.yMinClip - yStart_00;
          if (0 < iVar15) {
            yStart_00 = ZvgENC.yMinClip;
          }
          iVar13 = 0;
          if (0 < iVar15) {
            iVar13 = iVar15;
          }
          uVar23 = uVar23 - iVar13;
        }
        uVar28 = (ulong)uVar23;
      }
      if ((uint)uVar28 == 0) goto LAB_00102ae8;
      if ((ZvgENC.encFlags & 4) != 0) {
        if ((int)xStart_00 < ZvgENC.xMinSpot) {
          ZvgENC.xMinSpot = xStart_00;
        }
        if (ZvgENC.xMaxSpot < (int)xStart_00) {
          ZvgENC.xMaxSpot = xStart_00;
        }
        if ((int)yStart_00 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = yStart_00;
        }
        if (ZvgENC.yMaxSpot < (int)yStart_00) {
          ZvgENC.yMaxSpot = yStart_00;
        }
        if ((int)uVar24 < ZvgENC.yMinSpot) {
          ZvgENC.yMinSpot = uVar24;
        }
        if (ZvgENC.yMaxSpot < (int)uVar24) {
          ZvgENC.yMaxSpot = uVar24;
        }
      }
      bVar21 = bVar5 | 0x20;
      if (0xff < (uint)uVar28) {
        bVar21 = bVar5;
      }
      uVar26 = (ulong)ZvgENC.encCount;
      ZvgENC.encCount = ZvgENC.encCount + 1;
      ZvgENC.encBfr[uVar26] = bVar2 | bVar21 | 6;
      if ((bVar21 & 0x40) != 0) {
        uVar26 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar26] = ZvgENC.encColor._1_1_;
        uVar26 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar26] = (uchar)ZvgENC.encColor;
      }
      if (0x7f < bVar21) {
        uVar26 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar26] = uVar20;
        uVar26 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar26] = (byte)(yStart_00 >> 8) & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
        uVar26 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar26] = (uchar)yStart_00;
      }
      uVar23 = xStart_00;
      if ((bVar21 & 0x20) != 0) goto LAB_001032b3;
      bVar17 = (byte)(uVar28 >> 8) & 0xf;
    }
    else {
      bVar17 = (byte)(uVar6 >> 8);
      if (uVar7 == uVar6) {
        if ((ZvgENC.encFlags & 4) != 0) {
          if ((int)xStart_00 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = xStart_00;
          }
          if (ZvgENC.xMaxSpot < (int)xStart_00) {
            ZvgENC.xMaxSpot = xStart_00;
          }
          if ((int)uVar23 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = uVar23;
          }
          if (ZvgENC.xMaxSpot < (int)uVar23) {
            ZvgENC.xMaxSpot = uVar23;
          }
          if ((int)yStart_00 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = yStart_00;
          }
          if (ZvgENC.yMaxSpot < (int)yStart_00) {
            ZvgENC.yMaxSpot = yStart_00;
          }
          if ((int)uVar24 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = uVar24;
          }
          if (ZvgENC.yMaxSpot < (int)uVar24) {
            ZvgENC.yMaxSpot = uVar24;
          }
        }
        bVar14 = bVar5 | 0x20;
        if (0xff < uVar6) {
          bVar14 = bVar5;
        }
        uVar26 = (ulong)ZvgENC.encCount;
        ZvgENC.encCount = ZvgENC.encCount + 1;
        ZvgENC.encBfr[uVar26] = bVar2 + ((int)uVar23 < (int)xStart_00) * '\x02' | bVar14;
        if ((bVar14 & 0x40) != 0) {
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = ZvgENC.encColor._1_1_;
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = (uchar)ZvgENC.encColor;
        }
        if (0x7f < bVar14) {
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = uVar20;
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = bVar21 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = uVar19;
        }
        if ((bVar14 & 0x20) != 0) goto LAB_001032b3;
        bVar17 = bVar17 & 0xf;
      }
      else {
        if ((ZvgENC.encFlags & 4) != 0) {
          if ((int)xStart_00 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = xStart_00;
          }
          if (ZvgENC.xMaxSpot < (int)xStart_00) {
            ZvgENC.xMaxSpot = xStart_00;
          }
          if ((int)uVar23 < ZvgENC.xMinSpot) {
            ZvgENC.xMinSpot = uVar23;
          }
          if (ZvgENC.xMaxSpot < (int)uVar23) {
            ZvgENC.xMaxSpot = uVar23;
          }
          if ((int)yStart_00 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = yStart_00;
          }
          if (ZvgENC.yMaxSpot < (int)yStart_00) {
            ZvgENC.yMaxSpot = yStart_00;
          }
          if ((int)uVar24 < ZvgENC.yMinSpot) {
            ZvgENC.yMinSpot = uVar24;
          }
          if (ZvgENC.yMaxSpot < (int)uVar24) {
            ZvgENC.yMaxSpot = uVar24;
          }
        }
        bVar14 = bVar2 + ((int)uVar23 < (int)xStart_00) * '\x02';
        if (uVar7 < uVar6) {
          auVar3._8_4_ = 0;
          auVar3._0_8_ = uVar28;
          auVar10._4_8_ = 0;
          auVar10._0_4_ = uVar7;
          auVar3 = (auVar10 << 0x10) / auVar3;
          bVar18 = bVar5 | 8;
          if (uVar6 < 0x80) {
            bVar18 = bVar5 | 0x28;
          }
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = bVar14 | bVar18;
          if ((bVar18 & 0x40) != 0) {
            uVar26 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar26] = ZvgENC.encColor._1_1_;
            uVar26 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar26] = (uchar)ZvgENC.encColor;
          }
          if (0x7f < bVar18) {
            uVar26 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar26] = uVar20;
            uVar26 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar26] = bVar21 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
            uVar26 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar26] = uVar19;
          }
          uVar26 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar26] = auVar3[1];
          if ((bVar18 & 0x20) != 0) goto LAB_001032b3;
          bVar17 = bVar17 & 0xf | auVar3[0] & 0xf0;
        }
        else {
          auVar4._4_8_ = 0;
          auVar4._0_4_ = uVar7;
          auVar11._4_8_ = 0;
          auVar11._0_4_ = uVar6;
          auVar4 = (auVar11 << 0x10) / auVar4;
          bVar17 = bVar5 | 8;
          if (uVar7 < 0x80) {
            bVar17 = bVar5 | 0x28;
          }
          uVar28 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar28] = bVar14 | bVar17 | 4;
          if ((bVar17 & 0x40) != 0) {
            uVar28 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar28] = ZvgENC.encColor._1_1_;
            uVar28 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar28] = (uchar)ZvgENC.encColor;
          }
          if (0x7f < bVar17) {
            uVar28 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar28] = uVar20;
            uVar28 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar28] = bVar21 & 0xf | (byte)(xStart_00 >> 4) & 0xf0;
            uVar28 = (ulong)ZvgENC.encCount;
            ZvgENC.encCount = ZvgENC.encCount + 1;
            ZvgENC.encBfr[uVar28] = uVar19;
          }
          uVar28 = (ulong)ZvgENC.encCount;
          ZvgENC.encCount = ZvgENC.encCount + 1;
          ZvgENC.encBfr[uVar28] = auVar4[1];
          uVar28 = (ulong)uVar7;
          if ((bVar17 & 0x20) != 0) goto LAB_001032b3;
          bVar17 = (byte)(uVar7 >> 8) & 0xf | auVar4[0] & 0xf0;
        }
      }
    }
  }
  uVar26 = (ulong)ZvgENC.encCount;
  ZvgENC.encCount = ZvgENC.encCount + 1;
  ZvgENC.encBfr[uVar26] = bVar17;
LAB_001032b3:
  uVar26 = (ulong)ZvgENC.encCount;
  ZvgENC.encCount = ZvgENC.encCount + 1;
  ZvgENC.encBfr[uVar26] = (uchar)uVar28;
  ZvgENC.zColor = ZvgENC.encColor;
  ZvgENC.yPos = uVar24;
  ZvgENC.xPos = uVar23;
  return;
}

Assistant:

void zvgEnc( int xStart, int yStart, int xEnd, int yEnd)
{
	uint	xLen, yLen;
	uint	xSign, ySign, vRatio;
	uint	zvgCmd;
	int	diff;

	ZvgENC.vecCount++;						// count number of vectors

	// check for axis flips

	if (ZvgENC.encFlags & ENCF_FLIPX)
	{	xStart = ~xStart;
		xEnd = ~xEnd;
	}

	if (ZvgENC.encFlags & ENCF_FLIPY)
	{	yStart = ~yStart;
		yEnd = ~yEnd;
	}

	// Check if NOT a point, vertical or horizontal line, then
	// clip the line the old fashion way.

	if (xStart != xEnd && yStart != yEnd)
		if (!clipLine( &xStart, &yStart, &xEnd, &yEnd))
			return;								// if vector rejected, just return

	// Check for point

	if (xStart == xEnd && yStart == yEnd)
	{
		// clip data point

		if (xStart < ZvgENC.xMinClip)
			return;								// do nothing if outside window

		if (xStart > ZvgENC.xMaxClip)
			return;								// do nothing if outside window

		if (yStart < ZvgENC.yMinClip)
			return;								// do nothing if outside window

		if (yStart > ZvgENC.yMaxClip)
			return;								// do nothing if outside window

		// encode data point
		zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
		return;
	}

	// Handle vectors.

	zvgCmd = zbVECTOR;						// indicate a vector is being drawn

	// Check to see if color has changed

	if (ZvgENC.encColor != ZvgENC.zColor)
		zvgCmd |= zbCOLOR;					// indicate color information is to be sent

	// Check to see if start of this vector is same as current trace position
	// (if start point is the same a previous, then it does not need to be clipped)

	if (xStart != ZvgENC.xPos || yStart != ZvgENC.yPos)
		zvgCmd |= zbABS;						// if not, the starting points must be sent

	// get direction of X and Y axis, and their respective lengths

	if (xEnd < xStart)
	{	xSign = 1;								// moves from right to left
		xLen = xStart - xEnd;				// get length of X axis
	}
	else
	{	xSign = 0;								// moves from left to right
		xLen = xEnd - xStart;				// get length of X axis
	}

	if (yEnd < yStart)
	{	ySign = 1;								// moves downward
		yLen = yStart - yEnd;				// get length of Y axis
	}
	else
	{	ySign = 0;	 							// moves upward
		yLen = yEnd - yStart;				// get length of Y axis
	}

	// check for horizontal line

	if (yLen == 0)
	{
		// clip vector if needed

		if (yStart < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
			return; 						// reject vector

		// Does vector move from right to left?

		if (xSign)
		{
			if (xEnd > ZvgENC.xMaxClip || xStart < ZvgENC.xMinClip)
				return;					// reject vector

			diff = ZvgENC.xMinClip - xEnd;

			if (diff > 0)
			{	xEnd += diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = xStart - ZvgENC.xMaxClip;

				if (diff > 0)
				{	xStart -= diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// Else, vector moves from left to right

		else
		{
			if (xEnd < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
				return;					// reject vector

			diff = xEnd - ZvgENC.xMaxClip;

			if (diff > 0)
			{	xEnd -= diff;			// clip line
				xLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.xMinClip - xStart;

				if (diff > 0)
				{	xStart += diff;	// clip line
					xLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (xLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
		}

		// if length fits in 8 bits, use short version of command

		if (xLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | xSign;

		// send color if needed

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		else
			sendLen12( xLen);
	}

	// check for vertical line

	else if (xLen == 0)
	{
		// clip vector if needed

		if (xStart < ZvgENC.xMinClip || xStart > ZvgENC.xMaxClip)
			return; 						// reject vector

		// Does vector move downward?

		if (ySign)
		{
			if (yEnd > ZvgENC.yMaxClip || yStart < ZvgENC.yMinClip)
				return;					// reject vector

			diff = ZvgENC.yMinClip - yEnd;

			if (diff > 0)
			{	yEnd += diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = yStart - ZvgENC.yMaxClip;

				if (diff > 0)
				{	yStart -= diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// Else, vector moves upward

		else
		{
			if (yEnd < ZvgENC.yMinClip || yStart > ZvgENC.yMaxClip)
				return;					// reject vector

			diff = yEnd - ZvgENC.yMaxClip;

			if (diff > 0)
			{	yEnd -= diff;			// clip line
				yLen -= diff;
			}

			// if new starting points sent, they must be clipped

			if (zvgCmd & zbABS)
			{
				diff = ZvgENC.yMinClip - yStart;

				if (diff > 0)
				{	yStart += diff;	// clip line
					yLen -= diff;
				}
			}
		}

		// check if vector clipped to a point, if so, encode point

		if (yLen == 0)
		{	zvgEncPointSK( xStart, yStart, ZvgENC.encColor);
			return;						// done sending point, return
		}

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, use short version of command

		if (yLen < 256)
			zvgCmd |= zbSHORT;			// use short length

		// send command

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbHZVT | zbVERT | ySign;

		// send color if needed

		if (zvgCmd & zbCOLOR)		
			sendColor( ZvgENC.encColor);

		// send starting positions if needed

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// send length, short or long

		if (zvgCmd & zbSHORT)
			sendLen8( yLen);
	
		else
			sendLen12( yLen);
	}

	// look for 45 degree angle

	else if (yLen == xLen)
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		// if length fits in 8 bits, send short length

		if (xLen < 256)
			zvgCmd |= zbSHORT;				// use short length

		// send ZVG command, and direction

		ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

		if (zvgCmd & zbCOLOR)
			sendColor( ZvgENC.encColor);

		// if starting points required, send them

		if (zvgCmd & zbABS)
			sendXY( xStart, yStart);

		// if short length, send it

		if (zvgCmd & zbSHORT)
			sendLen8( xLen);
	
		// else, send long length

		else
			sendLen12( xLen);
	}

	// If not 45 degree angle, vertical, or horizontal, then ratio must be
	// calculated.

	else
	{
		// spot kill test

		if (ZvgENC.encFlags & ENCF_SPOTKILL)
		{
			CHECK_X_SPOT( xStart)
			CHECK_X_SPOT( xEnd)
			CHECK_Y_SPOT( yStart)
			CHECK_Y_SPOT( yEnd)
		}

		zvgCmd |= zbRATIO;					// indicate ratio being sent

		if (xLen > yLen)
		{
			// calculate integer ratio

			vRatio = (uint)(((ulong)yLen << 16) / xLen);

			// if length can fit in 7 bits, send short version of command

			if (xLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, xLen);
	
			else
				sendRatioLen12( vRatio, xLen);
		}

		// Else, Y length is greater than X length.

		else
		{
			// calculate ratio

			vRatio = (unsigned int)(((long)xLen << 16) / yLen);

			// if length can fit in 7 bits, send short version of command

			if (yLen < 128)
				zvgCmd |= zbSHORT;			// use short length

			// send command

			ZvgENC.encBfr[ZvgENC.encCount++] = zvgCmd | zbYLEN | (xSign << 1) | ySign;

			// send color if needed
		
			if (zvgCmd & zbCOLOR)
				sendColor( ZvgENC.encColor);

			// send start positions if needed

			if (zvgCmd & zbABS)
				sendXY( xStart, yStart);

			// send length and ratio, short or long

			if (zvgCmd & zbSHORT)
				sendRatioLen8( vRatio, yLen);
	
			else
				sendRatioLen12( vRatio, yLen);
		}
	}
	ZvgENC.xPos = xEnd;						// new position is end of vector
	ZvgENC.yPos = yEnd;
	ZvgENC.zColor = ZvgENC.encColor;		// save new color
}